

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerSPH::ChProximityContainerSPH(ChProximityContainerSPH *this)

{
  list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_> *plVar1;
  undefined1 auVar2 [16];
  
  ChObj::ChObj((ChObj *)this);
  *(undefined8 *)
   ((long)&(this->super_ChProximityContainer).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChProximityContainer).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChProximityContainer).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.offset_w = 0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.offset_L = 0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.system = (ChSystem *)0x0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChProximityContainer).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auVar2 = ZEXT416(0) << 0x40;
  (this->super_ChProximityContainer).add_proximity_callback = (AddProximityCallback *)auVar2._0_8_;
  (this->super_ChProximityContainer).report_proximity_callback =
       (ReportProximityCallback *)auVar2._8_8_;
  (this->super_ChProximityContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChProximityContainerSPH_00b38490;
  plVar1 = &this->proximitylist;
  (this->proximitylist).
  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->proximitylist).
  super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  *(undefined1 (*) [16])
   &(this->proximitylist).
    super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl.
    _M_node._M_size = auVar2;
  this->n_added = 0;
  (this->lastproximity)._M_node = (_List_node_base *)plVar1;
  return;
}

Assistant:

ChProximityContainerSPH::ChProximityContainerSPH() : n_added(0) {
    lastproximity = proximitylist.begin();
}